

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::ClearRange
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint local_3c;
  uint local_38;
  int i_1;
  uint i;
  uint higherIndex;
  uint lowerIndex;
  uint h_local;
  uint l_local;
  uint level_local;
  ArenaAllocator *allocator_local;
  CharSetInner *this_local;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17b,"(level > 0)","level > 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  uVar4 = CharSetNode::lim(level);
  if (uVar4 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17c,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x17d,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if ((l != 0) || (uVar4 = CharSetNode::lim(level), h != uVar4)) {
    local_38 = CharSetNode::innerIdx(level,l);
    uVar4 = level - 1;
    uVar5 = CharSetNode::innerIdx(level,h);
    uVar6 = CharSetNode::lim(uVar4);
    uVar7 = CharSetNode::lim(uVar4);
    if (local_38 == uVar5) {
      if (this->children[local_38] != (CharSetNode *)0x0) {
        iVar8 = (*this->children[local_38]->_vptr_CharSetNode[3])
                          (this->children[local_38],allocator,(ulong)uVar4,(ulong)(l & uVar6),
                           (ulong)(h & uVar7));
        this->children[local_38] = (CharSetNode *)CONCAT44(extraout_var,iVar8);
      }
    }
    else {
      if (this->children[local_38] != (CharSetNode *)0x0) {
        pCVar1 = this->children[local_38];
        uVar9 = CharSetNode::lim(uVar4);
        iVar8 = (*pCVar1->_vptr_CharSetNode[3])
                          (pCVar1,allocator,(ulong)uVar4,(ulong)(l & uVar6),(ulong)uVar9);
        this->children[local_38] = (CharSetNode *)CONCAT44(extraout_var_00,iVar8);
      }
      while (local_38 = local_38 + 1, local_38 < uVar5) {
        if (this->children[local_38] != (CharSetNode *)0x0) {
          (**this->children[local_38]->_vptr_CharSetNode)(this->children[local_38],allocator);
        }
        this->children[local_38] = (CharSetNode *)0x0;
      }
      if (this->children[uVar5] != (CharSetNode *)0x0) {
        iVar8 = (*this->children[uVar5]->_vptr_CharSetNode[3])
                          (this->children[uVar5],allocator,(ulong)uVar4,0,(ulong)(h & uVar7));
        this->children[uVar5] = (CharSetNode *)CONCAT44(extraout_var_01,iVar8);
      }
    }
    for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
      if (this->children[(int)local_3c] != (CharSetNode *)0x0) {
        return &this->super_CharSetNode;
      }
    }
  }
  return (CharSetNode *)0x0;
}

Assistant:

CharSetNode* CharSetInner::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        uint lowerIndex = innerIdx(level, l);
        uint higherIndex = innerIdx(level--, h);
        l = l & lim(level);
        h = h & lim(level);
        if (lowerIndex == higherIndex)
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, h);
            }
        }
        else
        {
            if (children[lowerIndex] != nullptr)
            {
                children[lowerIndex] = children[lowerIndex]->ClearRange(allocator, level, l, lim(level));
            }

            for (uint i = lowerIndex + 1; i < higherIndex; i++)
            {
                if (children[i] != nullptr)
                {
                    children[i]->FreeSelf(allocator);
                }

                children[i] = nullptr;
            }

            if (children[higherIndex] != nullptr)
            {
                children[higherIndex] = children[higherIndex]->ClearRange(allocator, level, 0, h);
            }
        }
        for (int i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
            {
                return this;
            }
        }

        return nullptr;
    }